

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

size_t kvtree_pack(char *buf,kvtree *hash)

{
  char *__dest;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  kvtree_elem_struct *pkVar4;
  long lVar5;
  size_t sVar6;
  
  if (hash == (kvtree *)0x0) {
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
  }
  else {
    uVar1 = 0;
    for (pkVar4 = hash->lh_first; pkVar4 != (kvtree_elem_struct *)0x0;
        pkVar4 = (pkVar4->pointers).le_next) {
      uVar1 = uVar1 + 1;
    }
    *(uint *)buf = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    pkVar4 = hash->lh_first;
    if (pkVar4 != (kvtree_elem_struct *)0x0) {
      sVar6 = 4;
      do {
        __dest = buf + sVar6;
        if (pkVar4->key == (char *)0x0) {
          *__dest = '\0';
          lVar5 = 1;
        }
        else {
          strcpy(__dest,pkVar4->key);
          sVar2 = strlen(pkVar4->key);
          lVar5 = sVar2 + 1;
        }
        sVar3 = kvtree_pack(__dest + lVar5,pkVar4->hash);
        sVar6 = sVar6 + lVar5 + sVar3;
        pkVar4 = (pkVar4->pointers).le_next;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
      return sVar6;
    }
  }
  return 4;
}

Assistant:

size_t kvtree_pack(char* buf, const kvtree* hash)
{
  size_t size = 0;
  if (hash != NULL) {
    kvtree_elem* elem;

    /* count the items in the hash */
    uint32_t count = 0;
    LIST_FOREACH(elem, hash, pointers) {
      count++;
    }

    /* pack the count value */
    uint32_t count_network = kvtree_hton32(count);
    memcpy(buf + size, &count_network, sizeof(uint32_t));
    size += sizeof(uint32_t);

    /* pack each element */
    LIST_FOREACH(elem, hash, pointers) {
      size += kvtree_elem_pack(buf + size, elem);
    }
  } else {
    /* no hash -- just pack the count of 0 */
    uint32_t count_network = kvtree_hton32((uint32_t) 0);
    memcpy(buf + size, &count_network, sizeof(uint32_t));
    size += sizeof(uint32_t);
  }
  return size;
}